

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall
OpenMD::SelectionCompiler::compile(SelectionCompiler *this,string *filename,string *script)

{
  bool bVar1;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t icharEnd;
  SelectionCompiler *in_stack_00000188;
  string local_48 [32];
  long local_28;
  string *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  std::__cxx11::string::operator=(in_RDI,in_RSI);
  std::__cxx11::string::operator=(in_RDI + 0x20,local_20);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x37c508);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x37c516);
  std::
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ::clear((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
           *)0x37c524);
  bVar1 = internalCompile(in_stack_00000188);
  if (bVar1) {
    local_1 = true;
  }
  else {
    local_28 = std::__cxx11::string::find((char)local_20,0xd);
    if (local_28 == -1) {
      local_28 = std::__cxx11::string::find((char)local_20,10);
      if (local_28 == -1) {
        local_28 = std::__cxx11::string::size();
      }
    }
    std::__cxx11::string::substr((ulong)local_48,(ulong)local_20);
    std::__cxx11::string::operator=(in_RDI + 0xb0,local_48);
    std::__cxx11::string::~string(local_48);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SelectionCompiler::compile(const std::string& filename,
                                  const std::string& script) {
    this->filename = filename;
    this->script   = script;
    lineNumbers.clear();
    lineIndices.clear();
    aatokenCompiled.clear();

    if (internalCompile()) { return true; }

    std::size_t icharEnd;
    if ((icharEnd = script.find('\r', ichCurrentCommand)) ==
            std::string::npos &&
        (icharEnd = script.find('\n', ichCurrentCommand)) ==
            std::string::npos) {
      icharEnd = script.size();
    }
    errorLine = script.substr(ichCurrentCommand, icharEnd);
    return false;
  }